

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system_posix.cxx
# Opt level: O2

bool xray_re::xr_file_system::file_exist(char *path)

{
  bool bVar1;
  CPath p;
  path local_30;
  
  CPath::CPath((CPath *)&local_30,path);
  CPath::make_preferred_abi_cxx11_((CPath *)&local_30);
  bVar1 = std::filesystem::exists(&local_30);
  if (bVar1) {
    bVar1 = std::filesystem::is_regular_file(&local_30);
  }
  else {
    bVar1 = false;
  }
  std::filesystem::__cxx11::path::~path(&local_30);
  return bVar1;
}

Assistant:

bool xr_file_system::file_exist(const char* path)
{
CPath p(path);

	p.make_preferred();

	return fs::exists(p) && fs::is_regular_file(p);
}